

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

Vector * duckdb::ListVector::GetEntryInternal<duckdb::Vector_const>(Vector *vector)

{
  VectorBuffer *pVVar1;
  type pVVar2;
  
  for (; vector->vector_type == DICTIONARY_VECTOR; vector = DictionaryVector::Child(vector)) {
  }
  pVVar1 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->auxiliary);
  pVVar2 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                     ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                      (pVVar1 + 1));
  return pVVar2;
}

Assistant:

T &ListVector::GetEntryInternal(T &vector) {
	D_ASSERT(vector.GetType().id() == LogicalTypeId::LIST || vector.GetType().id() == LogicalTypeId::MAP);
	if (vector.GetVectorType() == VectorType::DICTIONARY_VECTOR) {
		auto &child = DictionaryVector::Child(vector);
		return ListVector::GetEntry(child);
	}
	D_ASSERT(vector.GetVectorType() == VectorType::FLAT_VECTOR ||
	         vector.GetVectorType() == VectorType::CONSTANT_VECTOR);
	D_ASSERT(vector.auxiliary);
	D_ASSERT(vector.auxiliary->GetBufferType() == VectorBufferType::LIST_BUFFER);
	return vector.auxiliary->template Cast<VectorListBuffer>().GetChild();
}